

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::GetTapBranchInfo(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::TapBranchInfoStruct_(const_cfd::js::api::GetTapBranchInfoRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::TapBranchInfoStruct(cfd::js::api::GetTapBranchInfoRequestStruct_const&)>::
  function<cfd::js::api::TapBranchInfoStruct(&)(cfd::js::api::GetTapBranchInfoRequestStruct_const&),void>
            ((function<cfd::js::api::TapBranchInfoStruct(cfd::js::api::GetTapBranchInfoRequestStruct_const&)>
              *)&local_38,AddressStructApi::GetTapBranchInfo);
  ExecuteJsonApi<cfd::js::api::json::GetTapBranchInfoRequest,cfd::js::api::json::TapBranchInfo,cfd::js::api::GetTapBranchInfoRequestStruct,cfd::js::api::TapBranchInfoStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::TapBranchInfoStruct_(const_cfd::js::api::GetTapBranchInfoRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::GetTapBranchInfo(
    const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::GetTapBranchInfoRequest, api::json::TapBranchInfo,
      api::GetTapBranchInfoRequestStruct, api::TapBranchInfoStruct>(
      request_message, AddressStructApi::GetTapBranchInfo);
}